

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  xmlChar *pxVar4;
  endDocumentSAXFunc p_Var5;
  charactersSAXFunc p_Var6;
  __int32_t *p_Var7;
  int iVar8;
  xmlDtdPtr pxVar9;
  ulong uVar10;
  _xmlSAXHandler *p_Var11;
  __int32_t **pp_Var12;
  xmlParserInputPtr pxVar13;
  xmlChar *pxVar14;
  undefined8 in_R8;
  size_t extraLen;
  bool bVar15;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    return 0x73;
  }
  pxVar13 = ctxt->input;
  if (pxVar13 == (xmlParserInputPtr)0x0) {
    return 0x73;
  }
  if (size < 0 || pxVar13->buf == (xmlParserInputBufferPtr)0x0) {
    return 0x73;
  }
  extraLen = CONCAT71((int7)((ulong)in_R8 >> 8),size != 0);
  if (chunk == (char *)0x0 && size != 0) {
    return 0x73;
  }
  if (1 < ctxt->disableSAX) goto LAB_00168651;
  if (size == 0) {
LAB_00168192:
    bVar15 = terminate == 0;
    while (pxVar13 = ctxt->input, pxVar13 != (xmlParserInputPtr)0x0) {
      if (0x12 < (uint)(ctxt->instate + XML_PARSER_MISC)) {
switchD_001681db_caseD_2:
        extraLen = 2;
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_HTML,XML_ERR_INTERNAL_ERROR,XML_ERR_ERROR,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"HPP: internal error\n",0,0);
        ctxt->instate = XML_PARSER_EOF;
        goto LAB_00168423;
      }
      pxVar14 = pxVar13->cur;
      uVar10 = (long)pxVar13->end - (long)pxVar14;
      switch(ctxt->instate) {
      case XML_PARSER_START:
        if (bVar15 && uVar10 < 4) goto switchD_001681db_caseD_ffffffff;
        xmlDetectEncoding(ctxt);
        if (((ctxt->input->flags & 1) == 0) &&
           (iVar8 = xmlStrncmp(ctxt->input->cur,(xmlChar *)"<?xm",4), iVar8 == 0)) {
          xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_UTF8);
        }
      case XML_PARSER_XML_DECL:
        p_Var11 = ctxt->sax;
        if (p_Var11 != (_xmlSAXHandler *)0x0) {
          if (p_Var11->setDocumentLocator != (setDocumentLocatorSAXFunc)0x0) {
            (*p_Var11->setDocumentLocator)(ctxt->userData,&xmlDefaultSAXLocator);
            p_Var11 = ctxt->sax;
            if (p_Var11 == (_xmlSAXHandler *)0x0) goto LAB_0016837b;
          }
          if ((p_Var11->startDocument != (startDocumentSAXFunc)0x0) && (ctxt->disableSAX == 0)) {
            (*p_Var11->startDocument)(ctxt->userData);
          }
        }
LAB_0016837b:
        if ((ctxt->instate == XML_PARSER_XML_DECL) || (ctxt->instate == XML_PARSER_START)) {
          ctxt->instate = XML_PARSER_MISC;
        }
        break;
      case XML_PARSER_MISC:
      case XML_PARSER_PROLOG:
        htmlSkipBlankChars(ctxt);
        pxVar14 = pxVar13->cur;
        uVar10 = (long)pxVar13->end - (long)pxVar14;
      case XML_PARSER_CONTENT:
        if (uVar10 == 0) goto switchD_001681db_caseD_ffffffff;
        if (ctxt->endCheckState == 0) {
          if (*pxVar14 != '<') {
            ctxt->instate = XML_PARSER_CONTENT;
            if (((terminate != 0) || (999 < uVar10)) ||
               (iVar8 = htmlParseLookupString(ctxt,0,"<",1,extraLen), -1 < iVar8)) {
              ctxt->checkIndex = 0;
              goto LAB_00168416;
            }
            goto switchD_001681db_caseD_ffffffff;
          }
          if (uVar10 == 1) {
            if (bVar15) goto LAB_00168651;
LAB_0016822a:
            ctxt->instate = XML_PARSER_CONTENT;
            htmlStartCharData(ctxt);
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
               (p_Var6 = ctxt->sax->characters, p_Var6 != (charactersSAXFunc)0x0)) {
              (*p_Var6)(ctxt->userData,"<",1);
            }
            pxVar13 = ctxt->input;
            ppxVar1 = &pxVar13->cur;
            *ppxVar1 = *ppxVar1 + 1;
            piVar2 = &pxVar13->col;
            *piVar2 = *piVar2 + 1;
          }
          else {
            bVar3 = pxVar14[1];
            if (bVar3 != 0x3f) {
              if (bVar3 == 0x2f) {
                ctxt->instate = XML_PARSER_END_TAG;
              }
              else {
                if (bVar3 == 0x21) {
                  if (!bVar15 || 3 < uVar10) {
                    if ((pxVar14[2] == '-') && (pxVar14[3] == '-')) {
                      if ((!bVar15) || (iVar8 = htmlParseLookupCommentEnd(ctxt), -1 < iVar8)) {
                        pxVar13 = ctxt->input;
                        ppxVar1 = &pxVar13->cur;
                        *ppxVar1 = *ppxVar1 + 4;
                        piVar2 = &pxVar13->col;
                        *piVar2 = *piVar2 + 4;
                        iVar8 = 0;
                        goto LAB_001685fb;
                      }
                      goto LAB_00168651;
                    }
                    if (!bVar15 || 8 < uVar10) {
                      pp_Var12 = __ctype_toupper_loc();
                      p_Var7 = *pp_Var12;
                      pxVar13 = ctxt->input;
                      pxVar14 = pxVar13->cur;
                      if ((((p_Var7[pxVar14[2]] == 0x44) && (p_Var7[pxVar14[3]] == 0x4f)) &&
                          (p_Var7[pxVar14[4]] == 0x43)) &&
                         (((p_Var7[pxVar14[5]] == 0x54 && (p_Var7[pxVar14[6]] == 0x59)) &&
                          ((p_Var7[pxVar14[7]] == 0x50 && (p_Var7[pxVar14[8]] == 0x45)))))) {
                        if ((!bVar15) ||
                           (iVar8 = htmlParseLookupString(ctxt,9,">",1,extraLen), -1 < iVar8)) {
                          htmlParseDocTypeDecl(ctxt);
                          if (ctxt->instate == XML_PARSER_MISC) {
                            ctxt->instate = XML_PARSER_PROLOG;
                          }
                          else {
LAB_001682e6:
                            ctxt->instate = XML_PARSER_CONTENT;
                          }
                          break;
                        }
                        goto LAB_00168651;
                      }
                      ctxt->instate = XML_PARSER_CONTENT;
                      if (bVar15) {
                        iVar8 = htmlParseLookupString(ctxt,2,">",1,extraLen);
                        if (iVar8 < 0) goto LAB_00168651;
                        pxVar13 = ctxt->input;
                        pxVar14 = pxVar13->cur;
                      }
                      pxVar13->cur = pxVar14 + 2;
                      pxVar13->col = pxVar13->col + 2;
                      goto LAB_001685f3;
                    }
                  }
                  goto switchD_001681db_caseD_ffffffff;
                }
                if (0x19 < (byte)((bVar3 | 0x20) + 0x9f)) goto LAB_0016822a;
                ctxt->instate = XML_PARSER_START_TAG;
              }
LAB_001683c4:
              ctxt->checkIndex = 0;
              break;
            }
            if ((bVar15) && (iVar8 = htmlParseLookupString(ctxt,2,">",1,extraLen), iVar8 < 0))
            goto LAB_00168651;
            pxVar13 = ctxt->input;
            ppxVar1 = &pxVar13->cur;
            *ppxVar1 = *ppxVar1 + 1;
            piVar2 = &pxVar13->col;
            *piVar2 = *piVar2 + 1;
LAB_001685f3:
            iVar8 = 1;
LAB_001685fb:
            htmlParseComment(ctxt,iVar8);
          }
        }
        else {
LAB_00168416:
          iVar8 = htmlParseCharData(ctxt,(uint)(terminate == 0));
          if (iVar8 == 0) goto switchD_001681db_caseD_ffffffff;
        }
        break;
      default:
        goto switchD_001681db_caseD_2;
      case XML_PARSER_START_TAG:
        if ((!bVar15) || (iVar8 = htmlParseLookupGt(ctxt), -1 < iVar8)) {
          htmlParseElementInternal(ctxt);
          goto LAB_001682e6;
        }
        goto LAB_00168651;
      case XML_PARSER_END_TAG:
        if ((!bVar15) || (iVar8 = htmlParseLookupGt(ctxt), -1 < iVar8)) {
          htmlParseEndTag(ctxt);
          ctxt->instate = XML_PARSER_CONTENT;
          goto LAB_001683c4;
        }
        goto LAB_00168651;
      case XML_PARSER_EOF:
        goto switchD_001681db_caseD_ffffffff;
      }
LAB_00168423:
      if (1 < ctxt->disableSAX) break;
    }
  }
  else {
    pxVar14 = pxVar13->cur;
    pxVar4 = pxVar13->base;
    iVar8 = xmlParserInputBufferPush(pxVar13->buf,size,chunk);
    xmlBufUpdateInput(ctxt->input->buf->buffer,ctxt->input,(long)pxVar14 - (long)pxVar4);
    if (iVar8 < 0) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_HTML,ctxt->input->buf->error,XML_ERR_ERROR,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"xmlParserInputBufferPush failed",0,
                 0);
      xmlHaltParser(ctxt);
      goto LAB_00168651;
    }
    if (ctxt->disableSAX < 2) goto LAB_00168192;
  }
switchD_001681db_caseD_ffffffff:
  if ((terminate != 0) && (ctxt->instate != XML_PARSER_EOF)) {
    htmlAutoCloseOnEnd(ctxt);
    xmlParserCheckEOF(ctxt,XML_ERR_INTERNAL_ERROR);
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
       (p_Var5 = ctxt->sax->endDocument, p_Var5 != (endDocumentSAXFunc)0x0)) {
      (*p_Var5)(ctxt->userData);
    }
    if ((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
       (pxVar9 = xmlGetIntSubset(ctxt->myDoc), pxVar9 == (xmlDtdPtr)0x0)) {
      pxVar9 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                  (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                  (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
      ctxt->myDoc->intSubset = pxVar9;
      if (pxVar9 == (xmlDtdPtr)0x0) {
        xmlCtxtErrMemory(ctxt);
      }
    }
    ctxt->instate = XML_PARSER_EOF;
  }
LAB_00168651:
  return ctxt->errNo;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) ||
        (ctxt->input == NULL) || (ctxt->input->buf == NULL) ||
        (size < 0) ||
        ((size > 0) && (chunk == NULL)))
	return(XML_ERR_ARGUMENT);
    if (PARSER_STOPPED(ctxt) != 0)
        return(ctxt->errNo);

    if (size > 0)  {
	size_t pos = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufUpdateInput(ctxt->input->buf->buffer, ctxt->input, pos);
	if (res < 0) {
            htmlParseErr(ctxt, ctxt->input->buf->error,
                         "xmlParserInputBufferPush failed", NULL, NULL);
            xmlHaltParser(ctxt);
	    return (ctxt->errNo);
	}
    }

    htmlParseTryOrFinish(ctxt, terminate);

    if ((terminate) && (ctxt->instate != XML_PARSER_EOF)) {
        htmlAutoCloseOnEnd(ctxt);

        /*
         * Only check for truncated multi-byte sequences
         */
        xmlParserCheckEOF(ctxt, XML_ERR_INTERNAL_ERROR);

        if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
            ctxt->sax->endDocument(ctxt->userData);

        if ((!(ctxt->options & HTML_PARSE_NODEFDTD)) &&
            (ctxt->myDoc != NULL)) {
            xmlDtdPtr dtd;
            dtd = xmlGetIntSubset(ctxt->myDoc);
            if (dtd == NULL) {
                ctxt->myDoc->intSubset =
                    xmlCreateIntSubset(ctxt->myDoc, BAD_CAST "html",
                        BAD_CAST "-//W3C//DTD HTML 4.0 Transitional//EN",
                        BAD_CAST "http://www.w3.org/TR/REC-html40/loose.dtd");
                if (ctxt->myDoc->intSubset == NULL)
                    htmlErrMemory(ctxt);
            }
        }

	ctxt->instate = XML_PARSER_EOF;
    }

    return((xmlParserErrors) ctxt->errNo);
}